

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCreateRuleVariable
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  TargetType TVar1;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string var;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  var.field_2._8_8_ = config;
  TVar1 = GetType(this);
  switch(TVar1) {
  case EXECUTABLE:
    std::operator+(&local_d8,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_d8,"_LINK_EXECUTABLE");
    std::__cxx11::string::~string((string *)&local_d8);
    break;
  case STATIC_LIBRARY:
    std::operator+(&local_68,"CMAKE_",lang);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,"_CREATE_STATIC_LIBRARY");
    std::__cxx11::string::~string((string *)&local_68);
    GetFeatureSpecificLinkRuleVariable
              (__return_storage_ptr__,this,(string *)local_48,lang,(string *)var.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_48);
    break;
  case SHARED_LIBRARY:
    std::operator+(&local_98,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_98,"_CREATE_SHARED_LIBRARY");
    std::__cxx11::string::~string((string *)&local_98);
    break;
  case MODULE_LIBRARY:
    std::operator+(&local_b8,"CMAKE_",lang);
    std::operator+(__return_storage_ptr__,&local_b8,"_CREATE_SHARED_MODULE");
    std::__cxx11::string::~string((string *)&local_b8);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_d9);
    std::allocator<char>::~allocator(&local_d9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCreateRuleVariable(
  std::string const& lang, std::string const& config) const
{
  switch (this->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      std::string var = "CMAKE_" + lang + "_CREATE_STATIC_LIBRARY";
      return this->GetFeatureSpecificLinkRuleVariable(var, lang, config);
    }
    case cmStateEnums::SHARED_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_LIBRARY";
    case cmStateEnums::MODULE_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_MODULE";
    case cmStateEnums::EXECUTABLE:
      return "CMAKE_" + lang + "_LINK_EXECUTABLE";
    default:
      break;
  }
  return "";
}